

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_sigalgs_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  CBB sigalgs_cbb;
  CBB contents;
  CBB local_70;
  CBB local_40;
  
  bVar1 = true;
  if ((0x302 < hs->max_version) &&
     (bVar1 = true,
     (hs->pake_prover)._M_t.super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>
     ._M_t.super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl == (Prover *)0x0)) {
    iVar2 = CBB_add_u16(out_compressible,0xd);
    if ((iVar2 == 0) ||
       (((iVar2 = CBB_add_u16_length_prefixed(out_compressible,&local_40), iVar2 == 0 ||
         (iVar2 = CBB_add_u16_length_prefixed(&local_40,&local_70), iVar2 == 0)) ||
        (bVar1 = tls12_add_verify_sigalgs(hs,&local_70), !bVar1)))) {
      bVar1 = false;
    }
    else {
      iVar2 = CBB_flush(out_compressible);
      bVar1 = iVar2 != 0;
    }
  }
  return bVar1;
}

Assistant:

static bool ext_sigalgs_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                        CBB *out_compressible,
                                        ssl_client_hello_type_t type) {
  if (hs->max_version < TLS1_2_VERSION) {
    return true;
  }
  // In PAKE mode, signature_algorithms is not used.
  if (hs->pake_prover != nullptr) {
    return true;
  }

  CBB contents, sigalgs_cbb;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_signature_algorithms) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &sigalgs_cbb) ||
      !tls12_add_verify_sigalgs(hs, &sigalgs_cbb) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}